

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_attach(lua_State *L)

{
  byte bVar1;
  int iVar2;
  GCfunc *pGVar3;
  GCstr *pGVar4;
  TValue *pTVar5;
  MSize MVar6;
  byte *pbVar7;
  
  pGVar3 = lj_lib_checkfunc(L,1);
  pGVar4 = lj_lib_optstr(L,2);
  luaL_findtable(L,-10000,"_VMEVENTS",4);
  if (pGVar4 != (GCstr *)0x0) {
    MVar6 = pGVar4->len;
    bVar1 = (byte)pGVar4[1].nextgc.gcptr32;
    if (bVar1 != 0) {
      pbVar7 = (byte *)((long)&pGVar4[1].nextgc.gcptr32 + 1);
      do {
        MVar6 = MVar6 ^ (uint)bVar1 + (MVar6 << 6 | MVar6 >> 0x1a);
        bVar1 = *pbVar7;
        pbVar7 = pbVar7 + 1;
      } while (bVar1 != 0);
    }
    lua_pushvalue(L,1);
    lua_rawseti(L,-2,MVar6 << 3);
    *(undefined1 *)((ulong)(L->glref).ptr32 + 0x10b) = 0xff;
    return 0;
  }
  pTVar5 = L->top;
  L->top = pTVar5 + 1;
  do {
    (pTVar5->field_2).it = 0xffffffff;
    do {
      iVar2 = lua_next(L,-2);
      if (iVar2 == 0) {
        return 0;
      }
      pTVar5 = L->top;
      L->top = pTVar5 + -1;
    } while ((*(int *)((long)pTVar5 + -4) != -9) || (pGVar3 != (GCfunc *)(ulong)pTVar5[-1].u32.lo));
    pTVar5 = lj_tab_set(L,(GCtab *)(ulong)pTVar5[-3].u32.lo,pTVar5 + -2);
  } while( true );
}

Assistant:

LJLIB_CF(jit_attach)
{
#ifdef LUAJIT_DISABLE_VMEVENT
  luaL_error(L, "vmevent API disabled");
#else
  GCfunc *fn = lj_lib_checkfunc(L, 1);
  GCstr *s = lj_lib_optstr(L, 2);
  luaL_findtable(L, LUA_REGISTRYINDEX, LJ_VMEVENTS_REGKEY, LJ_VMEVENTS_HSIZE);
  if (s) {  /* Attach to given event. */
    const uint8_t *p = (const uint8_t *)strdata(s);
    uint32_t h = s->len;
    while (*p) h = h ^ (lj_rol(h, 6) + *p++);
    lua_pushvalue(L, 1);
    lua_rawseti(L, -2, VMEVENT_HASHIDX(h));
    G(L)->vmevmask = VMEVENT_NOCACHE;  /* Invalidate cache. */
  } else {  /* Detach if no event given. */
    setnilV(L->top++);
    while (lua_next(L, -2)) {
      L->top--;
      if (tvisfunc(L->top) && funcV(L->top) == fn) {
	setnilV(lj_tab_set(L, tabV(L->top-2), L->top-1));
      }
    }
  }
#endif
  return 0;
}